

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

stbi_uc * stbi__readval(stbi__context *s,int channel,stbi_uc *dest)

{
  stbi_uc sVar1;
  int iVar2;
  int i;
  long lVar3;
  int mask;
  uint uVar4;
  
  uVar4 = 0x80;
  lVar3 = 0;
  do {
    if ((uVar4 & channel) != 0) {
      if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_0010f4ca:
        if (s->img_buffer_end <= s->img_buffer) {
LAB_0010f4f4:
          stbi__g_failure_reason = "bad file";
          return (stbi_uc *)0x0;
        }
      }
      else {
        iVar2 = (*(s->io).eof)(s->io_user_data);
        if (iVar2 != 0) {
          if (s->read_from_callbacks == 0) goto LAB_0010f4f4;
          goto LAB_0010f4ca;
        }
      }
      sVar1 = stbi__get8(s);
      dest[lVar3] = sVar1;
    }
    lVar3 = lVar3 + 1;
    uVar4 = uVar4 >> 1;
    if (lVar3 == 4) {
      return dest;
    }
  } while( true );
}

Assistant:

static stbi_uc *stbi__readval(stbi__context *s, int channel, stbi_uc *dest)
{
   int mask=0x80, i;

   for (i=0; i<4; ++i, mask>>=1) {
      if (channel & mask) {
         if (stbi__at_eof(s)) return stbi__errpuc("bad file","PIC file too short");
         dest[i]=stbi__get8(s);
      }
   }

   return dest;
}